

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O0

EbmlElement * __thiscall
libebml::EbmlMaster::FindNextElt(EbmlMaster *this,EbmlElement *PastElt,bool bCreateIfNull)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference ppEVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  EbmlMaster *local_58;
  EbmlElement *NewElt;
  size_t local_48;
  EbmlId local_40;
  ulong local_30;
  size_t Index;
  EbmlElement *pEStack_20;
  bool bCreateIfNull_local;
  EbmlElement *PastElt_local;
  EbmlMaster *this_local;
  
  local_30 = 0;
  Index._7_1_ = bCreateIfNull;
  pEStack_20 = PastElt;
  PastElt_local = &this->super_EbmlElement;
  for (; uVar1 = local_30,
      sVar4 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::size
                        (&this->ElementList), uVar1 < sVar4; local_30 = local_30 + 1) {
    ppEVar5 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::
              operator[](&this->ElementList,local_30);
    if (*ppEVar5 == pEStack_20) {
      local_30 = local_30 + 1;
      break;
    }
  }
  do {
    uVar1 = local_30;
    sVar4 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::size
                      (&this->ElementList);
    if (sVar4 <= uVar1) {
LAB_001bc6be:
      uVar1 = local_30;
      sVar4 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::size
                        (&this->ElementList);
      if (uVar1 == sVar4) {
        if ((Index._7_1_ & 1) == 0) {
          this_local = (EbmlMaster *)0x0;
        }
        else {
          iVar3 = (*pEStack_20->_vptr_EbmlElement[5])();
          local_58 = (EbmlMaster *)CONCAT44(extraout_var_01,iVar3);
          if (local_58 == (EbmlMaster *)0x0) {
            this_local = (EbmlMaster *)0x0;
          }
          else {
            bVar2 = PushElement(this,(EbmlElement *)local_58);
            if (!bVar2) {
              if (local_58 != (EbmlMaster *)0x0) {
                (*(local_58->super_EbmlElement)._vptr_EbmlElement[1])();
              }
              local_58 = (EbmlMaster *)0x0;
            }
            this_local = local_58;
          }
        }
      }
      else {
        ppEVar5 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::
                  operator[](&this->ElementList,local_30);
        this_local = (EbmlMaster *)*ppEVar5;
      }
      return &this_local->super_EbmlElement;
    }
    iVar3 = (*pEStack_20->_vptr_EbmlElement[3])();
    local_40._0_8_ = *(undefined8 *)CONCAT44(extraout_var,iVar3);
    local_40.Length = ((undefined8 *)CONCAT44(extraout_var,iVar3))[1];
    ppEVar5 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::
              operator[](&this->ElementList,local_30);
    iVar3 = (*(*ppEVar5)->_vptr_EbmlElement[3])();
    NewElt = *(EbmlElement **)CONCAT44(extraout_var_00,iVar3);
    local_48 = ((undefined8 *)CONCAT44(extraout_var_00,iVar3))[1];
    bVar2 = EbmlId::operator==(&local_40,(EbmlId *)&NewElt);
    if (bVar2) goto LAB_001bc6be;
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

EbmlElement *EbmlMaster::FindNextElt(const EbmlElement & PastElt, bool bCreateIfNull)
{
  size_t Index;

  for (Index = 0; Index < ElementList.size(); Index++) {
    if ((ElementList[Index]) == &PastElt) {
      // found past element, new one is :
      Index++;
      break;
    }
  }

  while (Index < ElementList.size()) {
    if ((EbmlId)PastElt == (EbmlId)(*ElementList[Index]))
      break;
    Index++;
  }

  if (Index != ElementList.size())
    return ElementList[Index];

  if (bCreateIfNull) {
    // add the element
    EbmlElement *NewElt = &(PastElt.CreateElement());
    if (NewElt == NULL)
      return NULL;

    if (!PushElement(*NewElt)) {
      delete NewElt;
      NewElt = NULL;
    }
    return NewElt;
  }

  return NULL;
}